

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void Js::DynamicProfileInfo::WriteData<char16_t_const*>(char16 **sz,PAL_FILE *file)

{
  code *pcVar1;
  PAL_FILE *pf;
  bool bVar2;
  BOOL BVar3;
  size_t sVar4;
  HeapAllocator *this;
  undefined4 *puVar5;
  utf8char_t *dest;
  ulong byteSize;
  uint cchSource;
  undefined **local_60;
  size_t cbNeeded;
  ulong local_50;
  char *local_48;
  DWORD local_40;
  PAL_FILE *local_38;
  
  if (*sz == (char16_t *)0x0) {
    local_60 = (undefined **)((ulong)local_60 & 0xffffffff00000000);
    PAL_fwrite(&stack0xffffffffffffffa0,4,1,file);
  }
  else {
    local_38 = file;
    sVar4 = PAL_wcslen(*sz);
    cchSource = (uint)sVar4;
    if (0x55555555 < cchSource) {
      ::Math::DefaultOverflowPolicy();
    }
    byteSize = (ulong)(cchSource * 3);
    local_60 = &unsigned_char::typeinfo;
    cbNeeded = 0;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
    ;
    local_40 = 0x9f2;
    local_50 = byteSize;
    this = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)&stack0xffffffffffffffa0);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00976ff3;
      *puVar5 = 0;
    }
    dest = (utf8char_t *)Memory::HeapAllocator::AllocT<false>(this,byteSize);
    if (dest == (utf8char_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00976ff3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    local_60 = (undefined **)
               utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,byteSize,*sz,cchSource);
    pf = local_38;
    PAL_fwrite(&stack0xffffffffffffffa0,8,1,local_38);
    PAL_fwrite(dest,1,(size_t)local_60,pf);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,dest,(ulong)(cchSource * 3));
  }
  return;
}

Assistant:

void DynamicProfileInfo::WriteData<char16 const *>(char16 const * const& sz, FILE * file)
    {
        if (sz)
        {
            charcount_t len = static_cast<charcount_t>(wcslen(sz));
            const size_t cbTempBuffer = UInt32Math::Mul<3>(len);
            utf8char_t * tempBuffer = HeapNewArray(utf8char_t, cbTempBuffer);
            const size_t cbNeeded = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(tempBuffer, cbTempBuffer, sz, len);
            fwrite(&cbNeeded, sizeof(cbNeeded), 1, file);
            fwrite(tempBuffer, sizeof(utf8char_t), cbNeeded, file);
            HeapDeleteArray(len * 3, tempBuffer);
        }
        else
        {
            charcount_t len = 0;
            fwrite(&len, sizeof(len), 1, file);
        }
    }